

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Type,_8UL>::clear(ArrayWithPreallocation<soul::Type,_8UL> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->numActive != 0) {
    lVar1 = 0x10;
    uVar2 = 0;
    do {
      RefCountedPtr<soul::Structure>::decIfNotNull(*(Structure **)(&this->items->category + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (uVar2 < this->numActive);
  }
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (Type *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Type *)this->space;
    this->numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }